

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O3

Mat * __thiscall
ncnn::ModelBinFromDataReader::load
          (Mat *__return_storage_ptr__,ModelBinFromDataReader *this,int w,int type)

{
  pointer pcVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  pointer puVar9;
  ulong uVar10;
  pointer puVar11;
  char *pcVar12;
  size_t totalsize;
  size_t sVar13;
  ulong uVar14;
  size_t __n;
  anon_union_4_2_77b30072 flag_struct;
  vector<unsigned_char,_std::allocator<unsigned_char>_> index_array;
  void *ptr;
  vector<unsigned_short,_std::allocator<unsigned_short>_> float16_weights;
  uint local_4a8;
  uint local_4a4;
  size_t local_4a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_498;
  pointer local_478;
  pointer puStack_470;
  undefined8 local_468;
  undefined4 local_460;
  long *local_458;
  undefined4 local_450;
  int local_44c;
  undefined8 local_448;
  size_t local_440;
  vector<signed_char,_std::allocator<signed_char>_> local_438;
  undefined4 local_420;
  long *local_418;
  undefined4 local_410;
  int local_40c;
  undefined8 local_408;
  size_t local_400;
  
  if (type == 1) {
    local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x4;
    local_420 = 1;
    local_418 = (long *)0x0;
    local_410 = 1;
    local_408 = 0x100000001;
    sVar13 = (size_t)w;
    local_400 = sVar13;
    if (w == 0) {
      __return_storage_ptr__->data = (void *)0x0;
      __return_storage_ptr__->refcount = (int *)0x0;
      __return_storage_ptr__->elemsize = 4;
      __return_storage_ptr__->elempack = 1;
      __return_storage_ptr__->allocator = (Allocator *)0x0;
      __return_storage_ptr__->dims = 1;
      __return_storage_ptr__->w = 0;
      __return_storage_ptr__->h = 1;
      __return_storage_ptr__->c = 1;
      __return_storage_ptr__->cstep = sVar13;
      local_40c = w;
    }
    else {
      local_478 = (pointer)0x0;
      local_40c = w;
      iVar5 = posix_memalign(&local_478,0x10,sVar13 * 4 + 4);
      puVar11 = (pointer)0x0;
      if (iVar5 == 0) {
        puVar11 = local_478;
      }
      puVar9 = puVar11 + sVar13 * 2;
      puVar9[0] = 1;
      puVar9[1] = 0;
      local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)puVar11;
      local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)puVar9;
      lVar6 = (**(code **)(*(long *)this->dr + 0x18))(this->dr,local_478,sVar13 * 4);
      if (lVar6 == sVar13 * 4) {
        __return_storage_ptr__->data = puVar11;
        __return_storage_ptr__->refcount = (int *)puVar9;
        __return_storage_ptr__->elemsize = 4;
        __return_storage_ptr__->elempack = 1;
        __return_storage_ptr__->allocator = (Allocator *)0x0;
        __return_storage_ptr__->dims = 1;
        __return_storage_ptr__->w = w;
        __return_storage_ptr__->h = 1;
        __return_storage_ptr__->c = 1;
        __return_storage_ptr__->cstep = sVar13;
        LOCK();
        *(int *)(puVar11 + sVar13 * 2) = *(int *)(puVar11 + sVar13 * 2) + 1;
        UNLOCK();
      }
      else {
        fprintf(_stderr,"ModelBin read weight_data failed %zd\n",lVar6);
        __return_storage_ptr__->data = (void *)0x0;
        __return_storage_ptr__->refcount = (int *)0x0;
        *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
        __return_storage_ptr__->allocator = (Allocator *)0x0;
        __return_storage_ptr__->dims = 0;
        __return_storage_ptr__->w = 0;
        __return_storage_ptr__->h = 0;
        __return_storage_ptr__->c = 0;
        __return_storage_ptr__->cstep = 0;
      }
    }
    if ((pointer)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_finish == (pointer)0x0) {
      return __return_storage_ptr__;
    }
    LOCK();
    *(int *)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_finish =
         *(int *)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1;
    UNLOCK();
    if (*(int *)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                super__Vector_impl_data._M_finish != 0) {
      return __return_storage_ptr__;
    }
    puVar11 = (pointer)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
    if (local_418 != (long *)0x0) {
      (**(code **)(*local_418 + 0x18))();
      return __return_storage_ptr__;
    }
LAB_0011f1f4:
    if (puVar11 != (pointer)0x0) {
      free(puVar11);
    }
  }
  else {
    if (type == 0) {
      lVar6 = (**(code **)(*(long *)this->dr + 0x18))(this->dr,&local_4a8,4);
      if (lVar6 == 4) {
        if (local_4a8 == 0x2c056) {
          local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x4;
          local_420 = 1;
          local_418 = (long *)0x0;
          local_410 = 1;
          local_408 = 0x100000001;
          sVar13 = (size_t)w;
          local_400 = sVar13;
          if (w == 0) {
            __return_storage_ptr__->data = (void *)0x0;
            __return_storage_ptr__->refcount = (int *)0x0;
            __return_storage_ptr__->elemsize = 4;
            __return_storage_ptr__->elempack = 1;
            __return_storage_ptr__->allocator = (Allocator *)0x0;
            __return_storage_ptr__->dims = 1;
            __return_storage_ptr__->w = 0;
            __return_storage_ptr__->h = 1;
            __return_storage_ptr__->c = 1;
            __return_storage_ptr__->cstep = sVar13;
            local_40c = w;
          }
          else {
            local_478 = (pointer)0x0;
            local_40c = w;
            iVar5 = posix_memalign(&local_478,0x10,sVar13 * 4 + 4);
            puVar11 = (pointer)0x0;
            if (iVar5 == 0) {
              puVar11 = local_478;
            }
            puVar9 = puVar11 + sVar13 * 2;
            puVar9[0] = 1;
            puVar9[1] = 0;
            local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)puVar11;
            local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)puVar9;
            lVar6 = (**(code **)(*(long *)this->dr + 0x18))(this->dr,local_478,sVar13 * 4);
            if (lVar6 == sVar13 * 4) {
              __return_storage_ptr__->data = puVar11;
              __return_storage_ptr__->refcount = (int *)puVar9;
              __return_storage_ptr__->elemsize = 4;
              __return_storage_ptr__->elempack = 1;
              __return_storage_ptr__->allocator = (Allocator *)0x0;
              __return_storage_ptr__->dims = 1;
              __return_storage_ptr__->w = w;
              __return_storage_ptr__->h = 1;
              __return_storage_ptr__->c = 1;
              __return_storage_ptr__->cstep = sVar13;
              LOCK();
              *(int *)(puVar11 + sVar13 * 2) = *(int *)(puVar11 + sVar13 * 2) + 1;
              UNLOCK();
            }
            else {
              fprintf(_stderr,"ModelBin read weight_data failed %zd\n",lVar6);
              __return_storage_ptr__->data = (void *)0x0;
              __return_storage_ptr__->refcount = (int *)0x0;
              *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
              *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
              __return_storage_ptr__->allocator = (Allocator *)0x0;
              __return_storage_ptr__->dims = 0;
              __return_storage_ptr__->w = 0;
              __return_storage_ptr__->h = 0;
              __return_storage_ptr__->c = 0;
              __return_storage_ptr__->cstep = 0;
            }
          }
          if ((pointer)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
            return __return_storage_ptr__;
          }
          LOCK();
          *(int *)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                  super__Vector_impl_data._M_finish =
               *(int *)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish + -1;
          UNLOCK();
          if (*(int *)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish != 0) {
            return __return_storage_ptr__;
          }
          puVar11 = (pointer)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>
                             ._M_impl.super__Vector_impl_data._M_start;
          if (local_418 != (long *)0x0) {
            (**(code **)(*local_418 + 0x18))();
            return __return_storage_ptr__;
          }
          goto LAB_0011f1f4;
        }
        if (local_4a8 == 0xd4b38) {
          __n = (size_t)w;
          uVar14 = __n + 3 & 0xfffffffffffffffc;
          local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<signed_char,_std::allocator<signed_char>_>::resize(&local_438,uVar14);
          uVar7 = (**(code **)(*(long *)this->dr + 0x18))
                            (this->dr,local_438.
                                      super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                      _M_impl.super__Vector_impl_data._M_start,uVar14);
          if (uVar7 == uVar14) {
            __return_storage_ptr__->data = (void *)0x0;
            __return_storage_ptr__->refcount = (int *)0x0;
            __return_storage_ptr__->elemsize = 1;
            __return_storage_ptr__->elempack = 1;
            __return_storage_ptr__->allocator = (Allocator *)0x0;
            __return_storage_ptr__->dims = 1;
            __return_storage_ptr__->w = w;
            __return_storage_ptr__->h = 1;
            __return_storage_ptr__->c = 1;
            __return_storage_ptr__->cstep = __n;
            if (w != 0) {
              local_478 = (pointer)0x0;
              iVar5 = posix_memalign(&local_478,0x10,uVar14 + 4);
              puVar11 = (pointer)0x0;
              if (iVar5 == 0) {
                puVar11 = local_478;
              }
              __return_storage_ptr__->data = puVar11;
              __return_storage_ptr__->refcount = (int *)((long)puVar11 + uVar14);
              pcVar1 = (pointer)((long)puVar11 + uVar14);
              pcVar1[0] = '\x01';
              pcVar1[1] = '\0';
              pcVar1[2] = '\0';
              pcVar1[3] = '\0';
              if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep != 0) {
                memcpy(local_478,
                       local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,__n);
              }
            }
            goto LAB_0011f0b9;
          }
          pcVar12 = "ModelBin read int8_weights failed %zd\n";
        }
        else {
          local_440 = (size_t)w;
          if (local_4a8 != 0x1306b47) {
            uVar2 = local_4a8 >> 8;
            uVar3 = local_4a8 >> 0x10;
            local_478 = (pointer)0x0;
            puStack_470 = (pointer)0x0;
            local_468 = 4;
            local_460 = 1;
            local_458 = (long *)0x0;
            local_450 = 1;
            local_448 = 0x100000001;
            local_44c = w;
            if (w == 0) {
              __return_storage_ptr__->data = (void *)0x0;
              __return_storage_ptr__->refcount = (int *)0x0;
              __return_storage_ptr__->elemsize = 4;
              __return_storage_ptr__->elempack = 1;
              __return_storage_ptr__->allocator = (Allocator *)0x0;
              __return_storage_ptr__->dims = 1;
              __return_storage_ptr__->w = 0;
              __return_storage_ptr__->h = 1;
              __return_storage_ptr__->c = 1;
              __return_storage_ptr__->cstep = local_440;
            }
            else {
              uVar4 = local_4a8 & 0xff;
              local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_4a4 = local_4a8 >> 0x18;
              local_4a0 = local_440;
              iVar5 = posix_memalign((void **)&local_438,0x10,local_440 * 4 + 4);
              sVar13 = local_4a0;
              puVar11 = (pointer)0x0;
              if (iVar5 == 0) {
                puVar11 = (pointer)local_438.
                                   super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                   _M_impl.super__Vector_impl_data._M_start;
              }
              puVar9 = puVar11 + local_4a0 * 2;
              puVar9[0] = 1;
              puVar9[1] = 0;
              local_478 = puVar11;
              puStack_470 = puVar9;
              if ((uVar2 & 0xff) + uVar4 + (uVar3 & 0xff) == 0 && local_4a4 == 0) {
                if (((char)local_4a8 == '\0') &&
                   (lVar6 = local_4a0 * 4,
                   lVar8 = (**(code **)(*(long *)this->dr + 0x18))
                                     (this->dr,local_438.
                                               super__Vector_base<signed_char,_std::allocator<signed_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start,lVar6),
                   lVar8 != lVar6)) {
                  pcVar12 = "ModelBin read weight_data failed %zd\n";
                  goto LAB_0011f11f;
                }
              }
              else {
                lVar8 = (**(code **)(*(long *)this->dr + 0x18))(this->dr,&local_438,0x400);
                if (lVar8 != 0x400) {
                  pcVar12 = "ModelBin read quantization_value failed %zd\n";
LAB_0011f11f:
                  fprintf(_stderr,pcVar12,lVar8);
                  __return_storage_ptr__->data = (void *)0x0;
                  __return_storage_ptr__->refcount = (int *)0x0;
                  *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
                  *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
                  __return_storage_ptr__->allocator = (Allocator *)0x0;
                  __return_storage_ptr__->dims = 0;
                  __return_storage_ptr__->w = 0;
                  __return_storage_ptr__->h = 0;
                  __return_storage_ptr__->c = 0;
                  __return_storage_ptr__->cstep = 0;
                  goto LAB_0011f1ce;
                }
                uVar14 = sVar13 + 3 & 0xfffffffffffffffc;
                local_498.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_498.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_498.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_498,uVar14);
                uVar7 = (**(code **)(*(long *)this->dr + 0x18))
                                  (this->dr,local_498.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start,uVar14);
                if (uVar7 == uVar14) {
                  if (w < 1) goto LAB_0011f172;
                  uVar10 = 0;
                  do {
                    *(undefined4 *)(puVar11 + uVar10 * 2) =
                         *(undefined4 *)
                          ((long)&local_438.
                                  super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start +
                          (ulong)local_498.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar10] * 4);
                    uVar10 = uVar10 + 1;
                  } while ((uint)w != uVar10);
LAB_0011f177:
                  operator_delete(local_498.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_498.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_498.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                else {
                  fprintf(_stderr,"ModelBin read index_array failed %zd\n",uVar7);
                  __return_storage_ptr__->data = (void *)0x0;
                  __return_storage_ptr__->refcount = (int *)0x0;
                  *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
                  *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
                  __return_storage_ptr__->allocator = (Allocator *)0x0;
                  __return_storage_ptr__->dims = 0;
                  __return_storage_ptr__->w = 0;
                  __return_storage_ptr__->h = 0;
                  __return_storage_ptr__->c = 0;
                  __return_storage_ptr__->cstep = 0;
LAB_0011f172:
                  if (local_498.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) goto LAB_0011f177;
                }
                sVar13 = local_4a0;
                if (uVar7 != uVar14) goto LAB_0011f1ce;
              }
              __return_storage_ptr__->data = puVar11;
              __return_storage_ptr__->refcount = (int *)puVar9;
              __return_storage_ptr__->elemsize = 4;
              __return_storage_ptr__->elempack = 1;
              __return_storage_ptr__->allocator = (Allocator *)0x0;
              __return_storage_ptr__->dims = 1;
              __return_storage_ptr__->w = w;
              __return_storage_ptr__->h = 1;
              __return_storage_ptr__->c = 1;
              __return_storage_ptr__->cstep = sVar13;
              LOCK();
              *(int *)(puVar11 + sVar13 * 2) = *(int *)(puVar11 + sVar13 * 2) + 1;
              UNLOCK();
            }
LAB_0011f1ce:
            if (puStack_470 == (pointer)0x0) {
              return __return_storage_ptr__;
            }
            LOCK();
            *(int *)puStack_470 = *(int *)puStack_470 + -1;
            UNLOCK();
            if (*(int *)puStack_470 != 0) {
              return __return_storage_ptr__;
            }
            puVar11 = local_478;
            if (local_458 != (long *)0x0) {
              (**(code **)(*local_458 + 0x18))();
              return __return_storage_ptr__;
            }
            goto LAB_0011f1f4;
          }
          uVar14 = local_440 * 2 + 3 & 0xfffffffffffffffc;
          local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_438,uVar14);
          uVar7 = (**(code **)(*(long *)this->dr + 0x18))
                            (this->dr,local_438.
                                      super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                      _M_impl.super__Vector_impl_data._M_start,uVar14);
          if (uVar7 == uVar14) {
            Mat::from_float16(__return_storage_ptr__,
                              (unsigned_short *)
                              local_438.
                              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                              super__Vector_impl_data._M_start,w);
            goto LAB_0011f0b9;
          }
          pcVar12 = "ModelBin read float16_weights failed %zd\n";
        }
        fprintf(_stderr,pcVar12,uVar7);
        __return_storage_ptr__->data = (void *)0x0;
        __return_storage_ptr__->refcount = (int *)0x0;
        *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
        __return_storage_ptr__->allocator = (Allocator *)0x0;
        __return_storage_ptr__->dims = 0;
        __return_storage_ptr__->w = 0;
        __return_storage_ptr__->h = 0;
        __return_storage_ptr__->c = 0;
        __return_storage_ptr__->cstep = 0;
LAB_0011f0b9:
        if ((unsigned_short *)
            local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_start == (unsigned_short *)0x0) {
          return __return_storage_ptr__;
        }
        operator_delete(local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_438.
                              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_438.
                              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                              super__Vector_impl_data._M_start);
        return __return_storage_ptr__;
      }
      fprintf(_stderr,"ModelBin read flag_struct failed %zd\n",lVar6);
    }
    else {
      fprintf(_stderr,"ModelBin load type %d not implemented\n",(ulong)(uint)type);
    }
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
    __return_storage_ptr__->allocator = (Allocator *)0x0;
    __return_storage_ptr__->dims = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->h = 0;
    __return_storage_ptr__->c = 0;
    __return_storage_ptr__->cstep = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

Mat ModelBinFromDataReader::load(int w, int type) const
{
    if (type == 0)
    {
        size_t nread;

        union
        {
            struct
            {
                unsigned char f0;
                unsigned char f1;
                unsigned char f2;
                unsigned char f3;
            };
            unsigned int tag;
        } flag_struct;

        nread = dr.read(&flag_struct, sizeof(flag_struct));
        if (nread != sizeof(flag_struct))
        {
            fprintf(stderr, "ModelBin read flag_struct failed %zd\n", nread);
            return Mat();
        }

        unsigned int flag = flag_struct.f0 + flag_struct.f1 + flag_struct.f2 + flag_struct.f3;

        if (flag_struct.tag == 0x01306B47)
        {
            // half-precision data
            size_t align_data_size = alignSize(w * sizeof(unsigned short), 4);
            std::vector<unsigned short> float16_weights;
            float16_weights.resize(align_data_size);
            nread = dr.read(float16_weights.data(), align_data_size);
            if (nread != align_data_size)
            {
                fprintf(stderr, "ModelBin read float16_weights failed %zd\n", nread);
                return Mat();
            }

            return Mat::from_float16(float16_weights.data(), w);
        }
        else if (flag_struct.tag == 0x000D4B38)
        {
            // int8 data
            size_t align_data_size = alignSize(w, 4);
            std::vector<signed char> int8_weights;
            int8_weights.resize(align_data_size);
            nread = dr.read(int8_weights.data(), align_data_size);
            if (nread != align_data_size)
            {
                fprintf(stderr, "ModelBin read int8_weights failed %zd\n", nread);
                return Mat();
            }

            Mat m(w, (size_t)1u);
            if (m.empty())
                return m;

            memcpy(m.data, int8_weights.data(), w);

            return m;
        }
        else if (flag_struct.tag == 0x0002C056)
        {
            Mat m(w);
            if (m.empty())
                return m;

            // raw data with extra scaling
            nread = dr.read(m, w * sizeof(float));
            if (nread != w * sizeof(float))
            {
                fprintf(stderr, "ModelBin read weight_data failed %zd\n", nread);
                return Mat();
            }

            return m;
        }

        Mat m(w);
        if (m.empty())
            return m;

        if (flag != 0)
        {
            // quantized data
            float quantization_value[256];
            nread = dr.read(quantization_value, 256 * sizeof(float));
            if (nread != 256 * sizeof(float))
            {
                fprintf(stderr, "ModelBin read quantization_value failed %zd\n", nread);
                return Mat();
            }

            size_t align_weight_data_size = alignSize(w * sizeof(unsigned char), 4);
            std::vector<unsigned char> index_array;
            index_array.resize(align_weight_data_size);
            nread = dr.read(index_array.data(), align_weight_data_size);
            if (nread != align_weight_data_size)
            {
                fprintf(stderr, "ModelBin read index_array failed %zd\n", nread);
                return Mat();
            }

            float* ptr = m;
            for (int i = 0; i < w; i++)
            {
                ptr[i] = quantization_value[ index_array[i] ];
            }
        }
        else if (flag_struct.f0 == 0)
        {
            // raw data
            nread = dr.read(m, w * sizeof(float));
            if (nread != w * sizeof(float))
            {
                fprintf(stderr, "ModelBin read weight_data failed %zd\n", nread);
                return Mat();
            }
        }

        return m;
    }
    else if (type == 1)
    {
        Mat m(w);
        if (m.empty())
            return m;

        // raw data
        size_t nread = dr.read(m, w * sizeof(float));
        if (nread != w * sizeof(float))
        {
            fprintf(stderr, "ModelBin read weight_data failed %zd\n", nread);
            return Mat();
        }

        return m;
    }
    else
    {
        fprintf(stderr, "ModelBin load type %d not implemented\n", type);
        return Mat();
    }

    return Mat();
}